

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O3

void xLearn::MAEMetric::mae_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,real_t *error,size_t start_idx,size_t end_idx)

{
  pointer pfVar1;
  pointer pfVar2;
  float fVar3;
  ostream *poVar4;
  size_t i;
  float fVar5;
  undefined1 auVar6 [16];
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (start_idx <= end_idx) {
    *error = 0.0;
    if (start_idx < end_idx) {
      pfVar1 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar5 = 0.0;
      do {
        fVar3 = pfVar1[start_idx] - pfVar2[start_idx];
        start_idx = start_idx + 1;
        auVar6._0_4_ = -fVar3;
        auVar6._4_4_ = 0x80000000;
        auVar6._8_4_ = 0x80000000;
        auVar6._12_4_ = 0x80000000;
        auVar6 = vmaxss_avx(ZEXT416((uint)fVar3),auVar6);
        fVar5 = fVar5 + auVar6._0_4_;
        *error = fVar5;
      } while (end_idx != start_idx);
    }
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_6c.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"mae_accum_thread","");
  poVar4 = Logger::Start(ERR,&local_48,0x26b,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_GE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x26b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"end_idx",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"start_idx",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

static void mae_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               real_t* error,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *error = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      (*error) += abs((*Y)[i] - (*pred)[i]);
    }
  }